

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::UntypedFunctionMockerBase::UninterestingCallCleanupHandler::
~UninterestingCallCleanupHandler(UninterestingCallCleanupHandler *this)

{
  CallReaction reaction;
  string sStack_28;
  
  reaction = this->reaction;
  std::__cxx11::stringbuf::str();
  ReportUninterestingCall(reaction,&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

~UninterestingCallCleanupHandler() {
    ReportUninterestingCall(reaction, ss.str());
  }